

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

bool __thiscall
ON_SubD_FixedSizeHeap::Internal_ReserveSubDWorkspace_HashTable(ON_SubD_FixedSizeHeap *this)

{
  ON_SubD_FixedSizeHeap_ComponentPairHashElement **ppOVar1;
  ON_SubD_FixedSizeHeap_ComponentPairHashElement *pOVar2;
  bool bVar3;
  uint uVar4;
  
  uVar4 = (this->m_v_capacity >> 2) + 1;
  if (this->m_v_capacity == 0) {
    uVar4 = 0;
  }
  this->m_h_count = 0;
  if (this->m_h_capacity < uVar4) {
    this->m_h_capacity = 0;
    if (this->m_hash_elements != (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)0x0) {
      operator_delete__(this->m_hash_elements);
      this->m_hash_elements = (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)0x0;
    }
    if (this->m_hash_table != (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0) {
      operator_delete__(this->m_hash_table);
      this->m_hash_table = (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0;
    }
    ppOVar1 = (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)
              ON_SubD__Allocate((ulong)uVar4 << 3);
    this->m_hash_table = ppOVar1;
    if (ppOVar1 != (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0) {
      pOVar2 = (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)
               ON_SubD__Allocate((ulong)this->m_v_capacity * 0x18);
      this->m_hash_elements = pOVar2;
      if (pOVar2 != (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)0x0) {
        this->m_h_capacity = uVar4;
        goto LAB_0061dcee;
      }
      if (this->m_hash_table != (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0) {
        operator_delete__(this->m_hash_table);
      }
      this->m_hash_table = (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0;
    }
    bVar3 = false;
  }
  else {
LAB_0061dcee:
    bVar3 = true;
    if (((ulong)this->m_h_capacity != 0) &&
       (this->m_hash_table != (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0)) {
      memset(this->m_hash_table,0,(ulong)this->m_h_capacity << 3);
    }
  }
  return bVar3;
}

Assistant:

bool ON_SubD_FixedSizeHeap::Internal_ReserveSubDWorkspace_HashTable()
{
  const unsigned int hash_capacity = (m_v_capacity > 0) ? (m_v_capacity / 4 + 1) : 0;
  m_h_count = 0;
  if (hash_capacity > m_h_capacity)
  {
    m_h_capacity = 0;
    if (nullptr != m_hash_elements)
    {
      ON_SubD__Free(m_hash_elements);
      m_hash_elements = nullptr;
    }
    if (nullptr != m_hash_table)
    {
      ON_SubD__Free(m_hash_table);
      m_hash_table = nullptr;
    }
    m_hash_table = (ON_SubD_FixedSizeHeap_ComponentPairHashElement**)ON_SubD__Allocate(hash_capacity * sizeof(*m_hash_table));
    if (nullptr == m_hash_table)
      return false;
    m_hash_elements = (ON_SubD_FixedSizeHeap_ComponentPairHashElement*)ON_SubD__Allocate(m_v_capacity * sizeof(*m_hash_elements));
    if (nullptr == m_hash_elements)
    {
      ON_SubD__Free(m_hash_table);
      m_hash_table = nullptr;
      return false;
    }
    m_h_capacity = hash_capacity;
  }
  if ( m_h_capacity > 0 && nullptr != m_hash_table)
    memset(m_hash_table, 0, m_h_capacity * sizeof(*m_hash_table));
  return true;
}